

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O2

void read_debug_access_unit_delimiter_rbsp(h264_stream_t *h,bs_t *b)

{
  uint32_t uVar1;
  FILE *pFVar2;
  
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"%ld.%d: ",(long)b->p - (long)b->start,(ulong)(uint)b->bits_left);
  uVar1 = bs_read_u(b,3);
  h->aud->primary_pic_type = uVar1;
  pFVar2 = (FILE *)h264_dbgfile;
  if (h264_dbgfile == (FILE *)0x0) {
    pFVar2 = _stdout;
  }
  fprintf(pFVar2,"h->aud->primary_pic_type: %d \n",(ulong)uVar1);
  return;
}

Assistant:

void read_debug_access_unit_delimiter_rbsp(h264_stream_t* h, bs_t* b)
{
    printf("%ld.%d: ", (long int)(b->p - b->start), b->bits_left); h->aud->primary_pic_type = bs_read_u(b, 3); printf("h->aud->primary_pic_type: %d \n", h->aud->primary_pic_type); 
}